

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O2

LookupParameters * __thiscall cnn::Model::add_lookup_parameters(Model *this,uint n,Dim *d)

{
  LookupParameters *this_00;
  LookupParameters *p;
  LookupParameters *local_30;
  LookupParameters *local_28;
  
  this_00 = (LookupParameters *)operator_new(0x98);
  LookupParameters::LookupParameters(this_00,n,d);
  local_30 = this_00;
  local_28 = this_00;
  std::vector<cnn::ParametersBase*,std::allocator<cnn::ParametersBase*>>::
  emplace_back<cnn::ParametersBase*>
            ((vector<cnn::ParametersBase*,std::allocator<cnn::ParametersBase*>> *)this,
             (ParametersBase **)&local_30);
  std::vector<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>::push_back
            ((vector<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_> *)
             (this + 0x30),&local_28);
  return local_28;
}

Assistant:

LookupParameters* Model::add_lookup_parameters(unsigned n, const Dim& d) {
  LookupParameters* p = new LookupParameters(n,d);
  all_params.push_back(p);
  lookup_params.push_back(p);
  return p;
}